

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O0

bool __thiscall catalog::newTable(catalog *this,TableInfo *tableInfo)

{
  _Ios_Openmode _Var1;
  ostream *poVar2;
  void *this_00;
  ofstream local_218 [8];
  ofstream tablelist;
  TableInfo *tableInfo_local;
  catalog *this_local;
  
  this->tableNumber = this->tableNumber + 1;
  if ((this->anychangeornot & 1U) == 0) {
    this->anychangeornot = true;
  }
  _Var1 = std::operator|(_S_out,_S_bin);
  _Var1 = std::operator|(_Var1,_S_in);
  std::ofstream::ofstream(local_218,"./file/catalog/table.dat",_Var1);
  poVar2 = std::operator<<((ostream *)&std::cout,"current table number : ");
  this_00 = (void *)std::ostream::operator<<(poVar2,this->tableNumber);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::ostream::write((char *)local_218,(long)&this->tableNumber);
  writeTabletoFile(this,tableInfo,local_218);
  std::ofstream::close();
  addInfoToList(this,tableInfo);
  poVar2 = std::operator<<((ostream *)&std::cout,"create table successfully!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(local_218);
  return true;
}

Assistant:

bool catalog::newTable(TableInfo* tableInfo){
    tableNumber++; 
    if(anychangeornot == false)anychangeornot = true;
    std::ofstream tablelist("./file/catalog/table.dat", std::ios::out | std::ios::binary | std::ios::in);
    std::cout<<"current table number : "<<tableNumber<<std::endl;
    //增加文件中标明的table数目
    tablelist.write(reinterpret_cast<char*>(&tableNumber), sizeof(int));
    writeTabletoFile(tableInfo,tablelist);
    tablelist.close();
    addInfoToList(tableInfo);
    std::cout<<"create table successfully!"<<std::endl;
    return true;
}